

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  int iVar1;
  ImVec2 *pIVar2;
  ImVec2 *pIVar3;
  int iVar4;
  int iVar5;
  undefined4 unaff_R12D;
  uint uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar14;
  int iVar15;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float fVar16;
  float local_a8;
  float fStack_a4;
  undefined1 auVar12 [16];
  
  if (radius < 0.5) {
    iVar1 = (this->_Path).Size;
    if (iVar1 == (this->_Path).Capacity) {
      if (iVar1 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar1 / 2 + iVar1;
      }
      iVar14 = iVar1 + 1;
      if (iVar1 + 1 < iVar4) {
        iVar14 = iVar4;
      }
      pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar14 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar2,pIVar3,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar2;
      (this->_Path).Capacity = iVar14;
      iVar1 = (this->_Path).Size;
    }
    else {
      pIVar2 = (this->_Path).Data;
    }
    pIVar2[iVar1] = *center;
LAB_0019d9ad:
    (this->_Path).Size = (this->_Path).Size + 1;
    return;
  }
  if (num_segments < 1) {
    if (radius <= this->_Data->ArcFastRadiusCutoff) {
      fVar8 = (a_min * 48.0) / 6.2831855;
      fVar16 = (a_max * 48.0) / 6.2831855;
      if (a_min <= a_max) {
        fVar8 = ceilf(fVar8);
        iVar4 = (int)(float)(int)((int)fVar16 - (uint)(fVar16 < 0.0 && (float)(int)fVar16 != fVar16)
                                 );
        iVar14 = (int)fVar8;
        iVar15 = 0;
        iVar1 = iVar4 - iVar14;
        fStack_a4 = extraout_XMM0_Db_00;
      }
      else {
        fVar16 = ceilf(fVar16);
        fStack_a4 = 0.0;
        iVar4 = (int)fVar16;
        iVar14 = (int)(float)(int)((int)fVar8 - (uint)((float)(int)fVar8 != fVar8 && fVar8 < 0.0));
        iVar15 = (int)extraout_XMM0_Db;
        iVar1 = iVar14 - iVar4;
      }
      iVar5 = 0;
      if (0 < iVar1) {
        iVar5 = iVar1;
      }
      auVar11._0_4_ = (float)iVar4 * -3.1415927 + (float)iVar4 * -3.1415927;
      auVar11._4_4_ = (float)iVar14 * -3.1415927 + (float)iVar14 * -3.1415927;
      auVar11._8_4_ = (float)iVar15 * 0.0 + (float)iVar15 * 0.0;
      auVar11._12_4_ = (float)(int)fStack_a4 * 0.0 + (float)(int)fStack_a4 * 0.0;
      auVar11 = divps(auVar11,_DAT_001f6de0);
      iVar15 = -(uint)(1e-05 <= ABS(a_max + auVar11._0_4_));
      iVar7 = -(uint)(1e-05 <= ABS(a_min + auVar11._4_4_));
      auVar13._4_4_ = iVar7;
      auVar13._0_4_ = iVar15;
      auVar13._8_4_ = iVar7;
      auVar13._12_4_ = iVar7;
      auVar12._8_8_ = auVar13._8_8_;
      auVar12._4_4_ = iVar15;
      auVar12._0_4_ = iVar15;
      uVar6 = movmskpd(unaff_R12D,auVar12);
      iVar15 = (uint)(byte)((byte)uVar6 >> 1) + (uVar6 & 1) + iVar5 + (this->_Path).Size + 1;
      if ((this->_Path).Capacity < iVar15) {
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar15 << 3);
        pIVar2 = (this->_Path).Data;
        if (pIVar2 != (ImVec2 *)0x0) {
          memcpy(pIVar3,pIVar2,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar3;
        (this->_Path).Capacity = iVar15;
      }
      if ((byte)((byte)uVar6 >> 1) != 0) {
        fVar8 = center->x;
        fVar9 = cosf(a_min);
        fVar16 = center->y;
        fVar10 = sinf(a_min);
        iVar15 = (this->_Path).Size;
        if (iVar15 == (this->_Path).Capacity) {
          if (iVar15 == 0) {
            iVar5 = 8;
          }
          else {
            iVar5 = iVar15 / 2 + iVar15;
          }
          iVar7 = iVar15 + 1;
          if (iVar15 + 1 < iVar5) {
            iVar7 = iVar5;
          }
          pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
          pIVar3 = (this->_Path).Data;
          if (pIVar3 != (ImVec2 *)0x0) {
            memcpy(pIVar2,pIVar3,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = pIVar2;
          (this->_Path).Capacity = iVar7;
          iVar15 = (this->_Path).Size;
        }
        else {
          pIVar2 = (this->_Path).Data;
        }
        pIVar2[iVar15].x = radius * fVar9 + fVar8;
        pIVar2[iVar15].y = radius * fVar10 + fVar16;
        (this->_Path).Size = (this->_Path).Size + 1;
      }
      if (0 < iVar1) {
        _PathArcToFastEx(this,center,radius,iVar14,iVar4,0);
      }
      if ((uVar6 & 1) == 0) {
        return;
      }
      fVar8 = center->x;
      fVar9 = cosf(a_max);
      fVar16 = center->y;
      fVar10 = sinf(a_max);
      iVar1 = (this->_Path).Size;
      if (iVar1 == (this->_Path).Capacity) {
        if (iVar1 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar1 / 2 + iVar1;
        }
        iVar14 = iVar1 + 1;
        if (iVar1 + 1 < iVar4) {
          iVar14 = iVar4;
        }
        pIVar2 = (ImVec2 *)ImGui::MemAlloc((long)iVar14 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar2,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar2;
        (this->_Path).Capacity = iVar14;
        iVar1 = (this->_Path).Size;
      }
      else {
        pIVar2 = (this->_Path).Data;
      }
      pIVar2[iVar1].x = radius * fVar9 + fVar8;
      pIVar2[iVar1].y = radius * fVar10 + fVar16;
      goto LAB_0019d9ad;
    }
    local_a8 = ABS(a_max - a_min);
    iVar1 = _CalcCircleAutoSegmentCount(this,radius);
    fVar8 = ceilf(((float)iVar1 * local_a8) / 6.2831855);
    num_segments = (int)(6.2831855 / local_a8);
    if ((int)(6.2831855 / local_a8) < (int)fVar8) {
      num_segments = (int)fVar8;
    }
  }
  _PathArcToN(this,center,radius,a_min,a_max,num_segments);
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    if (num_segments > 0)
    {
        _PathArcToN(center, radius, a_min, a_max, num_segments);
        return;
    }

    // Automatic segment count
    if (radius <= _Data->ArcFastRadiusCutoff)
    {
        const bool a_is_reverse = a_max < a_min;

        // We are going to use precomputed values for mid samples.
        // Determine first and last sample in lookup table that belong to the arc.
        const float a_min_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_min / (IM_PI * 2.0f);
        const float a_max_sample_f = IM_DRAWLIST_ARCFAST_SAMPLE_MAX * a_max / (IM_PI * 2.0f);

        const int a_min_sample = a_is_reverse ? (int)ImFloor(a_min_sample_f) : (int)ImCeil(a_min_sample_f);
        const int a_max_sample = a_is_reverse ? (int)ImCeil(a_max_sample_f) : (int)ImFloor(a_max_sample_f);
        const int a_mid_samples = a_is_reverse ? ImMax(a_min_sample - a_max_sample, 0) : ImMax(a_max_sample - a_min_sample, 0);

        const float a_min_segment_angle = a_min_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const float a_max_segment_angle = a_max_sample * IM_PI * 2.0f / IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        const bool a_emit_start = ImAbs(a_min_segment_angle - a_min) >= 1e-5f;
        const bool a_emit_end = ImAbs(a_max - a_max_segment_angle) >= 1e-5f;

        _Path.reserve(_Path.Size + (a_mid_samples + 1 + (a_emit_start ? 1 : 0) + (a_emit_end ? 1 : 0)));
        if (a_emit_start)
            _Path.push_back(ImVec2(center.x + ImCos(a_min) * radius, center.y + ImSin(a_min) * radius));
        if (a_mid_samples > 0)
            _PathArcToFastEx(center, radius, a_min_sample, a_max_sample, 0);
        if (a_emit_end)
            _Path.push_back(ImVec2(center.x + ImCos(a_max) * radius, center.y + ImSin(a_max) * radius));
    }
    else
    {
        const float arc_length = ImAbs(a_max - a_min);
        const int circle_segment_count = _CalcCircleAutoSegmentCount(radius);
        const int arc_segment_count = ImMax((int)ImCeil(circle_segment_count * arc_length / (IM_PI * 2.0f)), (int)(2.0f * IM_PI / arc_length));
        _PathArcToN(center, radius, a_min, a_max, arc_segment_count);
    }
}